

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O1

CURLcode Curl_ntlm_core_mk_ntlmv2_hash
                   (char *user,size_t userlen,char *domain,size_t domlen,uchar *ntlmhash,
                   uchar *ntlmv2hash)

{
  size_t uznum;
  uint datalen;
  CURLcode CVar1;
  uchar *data;
  __int32_t **pp_Var2;
  size_t sVar3;
  
  uznum = (domlen + userlen) * 2;
  data = (uchar *)(*Curl_cmalloc)(uznum);
  if (data == (uchar *)0x0) {
    CVar1 = CURLE_OUT_OF_MEMORY;
  }
  else {
    if (userlen != 0) {
      sVar3 = 0;
      pp_Var2 = __ctype_toupper_loc();
      do {
        data[sVar3 * 2] = (uchar)(*pp_Var2)[user[sVar3]];
        data[sVar3 * 2 + 1] = '\0';
        sVar3 = sVar3 + 1;
      } while (userlen != sVar3);
    }
    if (domlen != 0) {
      sVar3 = 0;
      do {
        data[sVar3 * 2 + userlen * 2] = domain[sVar3];
        data[sVar3 * 2 + userlen * 2 + 1] = '\0';
        sVar3 = sVar3 + 1;
      } while (domlen != sVar3);
    }
    datalen = curlx_uztoui(uznum);
    CVar1 = Curl_hmac_md5(ntlmhash,0x10,data,datalen,ntlmv2hash);
    (*Curl_cfree)(data);
  }
  return CVar1;
}

Assistant:

CURLcode Curl_ntlm_core_mk_ntlmv2_hash(const char *user, size_t userlen,
                                       const char *domain, size_t domlen,
                                       unsigned char *ntlmhash,
                                       unsigned char *ntlmv2hash)
{
  /* Unicode representation */
  size_t identity_len = (userlen + domlen) * 2;
  unsigned char *identity = malloc(identity_len);
  CURLcode result = CURLE_OK;

  if(!identity)
    return CURLE_OUT_OF_MEMORY;

  ascii_uppercase_to_unicode_le(identity, user, userlen);
  ascii_to_unicode_le(identity + (userlen << 1), domain, domlen);

  result = Curl_hmac_md5(ntlmhash, 16, identity, curlx_uztoui(identity_len),
                         ntlmv2hash);

  free(identity);

  return result;
}